

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicyULT.cpp
# Opt level: O0

void __thiscall CTestXe_HP_CachePolicy::CheckPAT(CTestXe_HP_CachePolicy *this)

{
  bool bVar1;
  uint uVar2;
  Message *pMVar3;
  char *message;
  AssertHelper local_80;
  Message local_78 [3];
  uint local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  unsigned_long PATIndex;
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  unsigned_long Usage;
  CTestXe_HP_CachePolicy *this_local;
  
  ClientRequest.Override = 0;
  ClientRequest.IsOverridenByRegkey = 0;
  for (; (ulong)ClientRequest._32_8_ < 0x11e; ClientRequest._32_8_ = ClientRequest._32_8_ + 1) {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (&PATIndex,CommonULT::pGmmULTClientContext,ClientRequest._32_8_ & 0xffffffff);
    if (((ulong)ClientRequest._0_8_ >> 0x1d & 1) != 0) {
      uVar2 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x160))
                        (CommonULT::pGmmULTClientContext,0,ClientRequest._32_8_ & 0xffffffff);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar2;
      local_5c = 0xffffffff;
      testing::internal::CmpHelperNE<unsigned_long,unsigned_int>
                ((internal *)local_58,"PATIndex","((uint32_t)-1)",
                 (unsigned_long *)&gtest_ar.message_,&local_5c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
      if (!bVar1) {
        testing::Message::Message(local_78);
        pMVar3 = testing::Message::operator<<(local_78,(char (*) [8])"Usage# ");
        pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_long *)&ClientRequest.Override);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [24])": No matching PAT Index");
        message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                   ,0xed,message);
        testing::internal::AssertHelper::operator=(&local_80,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        testing::Message::~Message(local_78);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
    }
  }
  return;
}

Assistant:

void CTestXe_HP_CachePolicy::CheckPAT()
{
    // Check Usage PAT index against PAT settings
    for(unsigned long Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT ClientRequest = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        if(ClientRequest.Initialized == false) // undefined resource in platform
        {
            continue;
        }
        unsigned long PATIndex = pGmmULTClientContext->CachePolicyGetPATIndex(NULL, (GMM_RESOURCE_USAGE_TYPE)Usage, NULL, false); 
        //printf("Xe HPG: Usage: %d --> PAT Index: [%d]\n", Usage, PATIndex);
        EXPECT_NE(PATIndex, GMM_PAT_ERROR) << "Usage# " << Usage << ": No matching PAT Index";
    }
}